

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

int __thiscall ncnn::PriorBox::load_param(PriorBox *this,ParamDict *pd)

{
  int *piVar1;
  int iVar2;
  Mat *pMVar3;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar4;
  Mat local_410;
  Mat local_3c8;
  Mat local_380;
  Mat local_338;
  Mat local_2e0;
  Mat local_298;
  ParamDict *local_250;
  Mat *local_240;
  Mat *local_238;
  Mat *local_230;
  Mat *local_228;
  Mat *local_218;
  Mat *local_208;
  Mat *local_1f8;
  Mat *local_1e8;
  Mat *local_1d8;
  int local_1c8;
  undefined4 local_1c4;
  Mat *local_1c0;
  Mat *local_1b8;
  Mat *local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  Mat *local_1a0;
  Mat *local_198;
  Mat *local_190;
  int local_188;
  undefined4 local_184;
  Mat *local_180;
  Mat *local_178;
  Mat *local_170;
  int local_168;
  undefined4 local_164;
  Mat *local_160;
  int local_158;
  undefined4 local_154;
  Mat *local_150;
  int local_148;
  undefined4 local_144;
  Mat *local_140;
  int local_128;
  undefined4 local_124;
  Mat *local_120;
  int local_108;
  undefined4 local_104;
  Mat *local_100;
  int local_e8;
  undefined4 local_e4;
  Mat *local_e0;
  int local_c8;
  undefined4 local_c4;
  Mat *local_c0;
  int local_a8;
  undefined4 local_a4;
  Mat *local_a0;
  int local_88;
  undefined4 local_84;
  Mat *local_80;
  void *local_68;
  void *local_48;
  void *local_28;
  void *local_18;
  void *local_10;
  void *local_8;
  
  local_240 = &local_2e0;
  local_2e0.data = (void *)0x0;
  local_2e0.refcount = (int *)0x0;
  local_2e0.elemsize = 0;
  local_2e0.elempack = 0;
  local_2e0.allocator = (Allocator *)0x0;
  local_2e0.dims = 0;
  local_2e0.w = 0;
  local_2e0.h = 0;
  local_2e0.d = 0;
  local_2e0.c = 0;
  local_2e0.cstep = 0;
  local_250 = in_RSI;
  ParamDict::get(&local_298,in_RSI,0,local_240);
  pMVar3 = (Mat *)(in_RDI + 0xd0);
  local_180 = &local_298;
  local_178 = pMVar3;
  if (pMVar3 != local_180) {
    if (local_298.refcount != (int *)0x0) {
      local_184 = 1;
      LOCK();
      local_188 = *local_298.refcount;
      *local_298.refcount = *local_298.refcount + 1;
      UNLOCK();
    }
    local_160 = pMVar3;
    if (*(long *)(in_RDI + 0xd8) != 0) {
      piVar1 = *(int **)(in_RDI + 0xd8);
      local_164 = 0xffffffff;
      LOCK();
      local_168 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_168 == 1) {
        if (*(long *)(in_RDI + 0xf0) == 0) {
          local_8 = pMVar3->data;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0xf0) + 0x18))(*(long **)(in_RDI + 0xf0),pMVar3->data);
        }
      }
    }
    pMVar3->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0xe0) = 0;
    *(undefined4 *)(in_RDI + 0xe8) = 0;
    *(undefined4 *)(in_RDI + 0xf8) = 0;
    *(undefined4 *)(in_RDI + 0xfc) = 0;
    *(undefined4 *)(in_RDI + 0x100) = 0;
    *(undefined4 *)(in_RDI + 0x104) = 0;
    *(undefined4 *)(in_RDI + 0x108) = 0;
    *(undefined8 *)(in_RDI + 0x110) = 0;
    *(undefined8 *)(in_RDI + 0xd8) = 0;
    pMVar3->data = local_180->data;
    *(int **)(in_RDI + 0xd8) = local_180->refcount;
    *(size_t *)(in_RDI + 0xe0) = local_180->elemsize;
    *(int *)(in_RDI + 0xe8) = local_180->elempack;
    *(Allocator **)(in_RDI + 0xf0) = local_180->allocator;
    *(int *)(in_RDI + 0xf8) = local_180->dims;
    *(int *)(in_RDI + 0xfc) = local_180->w;
    *(int *)(in_RDI + 0x100) = local_180->h;
    *(int *)(in_RDI + 0x104) = local_180->d;
    *(int *)(in_RDI + 0x108) = local_180->c;
    *(size_t *)(in_RDI + 0x110) = local_180->cstep;
  }
  local_228 = &local_298;
  local_170 = pMVar3;
  local_80 = local_228;
  if (local_298.refcount != (int *)0x0) {
    local_84 = 0xffffffff;
    LOCK();
    local_88 = *local_298.refcount;
    *local_298.refcount = *local_298.refcount + -1;
    UNLOCK();
    if (local_88 == 1) {
      if (local_298.allocator == (Allocator *)0x0) {
        if (local_298.data != (void *)0x0) {
          free(local_298.data);
        }
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])(local_298.allocator,local_298.data);
      }
    }
  }
  local_298.data = (void *)0x0;
  local_298.elemsize = 0;
  local_298.elempack = 0;
  local_298.dims = 0;
  local_298.w = 0;
  local_298.h = 0;
  local_298.d = 0;
  local_298.c = 0;
  local_298.cstep = 0;
  local_298.refcount = (int *)0x0;
  local_218 = &local_2e0;
  local_a0 = local_218;
  if (local_2e0.refcount != (int *)0x0) {
    local_a4 = 0xffffffff;
    LOCK();
    local_a8 = *local_2e0.refcount;
    *local_2e0.refcount = *local_2e0.refcount + -1;
    UNLOCK();
    if (local_a8 == 1) {
      if (local_2e0.allocator == (Allocator *)0x0) {
        local_68 = local_2e0.data;
        if (local_2e0.data != (void *)0x0) {
          free(local_2e0.data);
        }
      }
      else {
        (*(local_2e0.allocator)->_vptr_Allocator[3])(local_2e0.allocator,local_2e0.data);
      }
    }
  }
  local_2e0.data = (void *)0x0;
  local_2e0.elemsize = 0;
  local_2e0.elempack = 0;
  local_2e0.dims = 0;
  local_2e0.w = 0;
  local_2e0.h = 0;
  local_2e0.d = 0;
  local_2e0.c = 0;
  local_2e0.cstep = 0;
  local_2e0.refcount = (int *)0x0;
  local_238 = &local_380;
  local_380.data = (void *)0x0;
  local_380.refcount = (int *)0x0;
  local_380.elemsize = 0;
  local_380.elempack = 0;
  local_380.allocator = (Allocator *)0x0;
  local_380.dims = 0;
  local_380.w = 0;
  local_380.h = 0;
  local_380.d = 0;
  local_380.c = 0;
  local_380.cstep = 0;
  ParamDict::get(&local_338,local_250,1,local_238);
  pMVar3 = (Mat *)(in_RDI + 0x118);
  local_1a0 = &local_338;
  local_198 = pMVar3;
  if (pMVar3 != local_1a0) {
    if (local_338.refcount != (int *)0x0) {
      local_1a4 = 1;
      LOCK();
      local_1a8 = *local_338.refcount;
      *local_338.refcount = *local_338.refcount + 1;
      UNLOCK();
    }
    local_150 = pMVar3;
    if (*(long *)(in_RDI + 0x120) != 0) {
      piVar1 = *(int **)(in_RDI + 0x120);
      local_154 = 0xffffffff;
      LOCK();
      local_158 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_158 == 1) {
        if (*(long *)(in_RDI + 0x138) == 0) {
          local_10 = pMVar3->data;
          if (local_10 != (void *)0x0) {
            free(local_10);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x138) + 0x18))(*(long **)(in_RDI + 0x138),pMVar3->data)
          ;
        }
      }
    }
    pMVar3->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x128) = 0;
    *(undefined4 *)(in_RDI + 0x130) = 0;
    *(undefined4 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x144) = 0;
    *(undefined4 *)(in_RDI + 0x148) = 0;
    *(undefined4 *)(in_RDI + 0x14c) = 0;
    *(undefined4 *)(in_RDI + 0x150) = 0;
    *(undefined8 *)(in_RDI + 0x158) = 0;
    *(undefined8 *)(in_RDI + 0x120) = 0;
    pMVar3->data = local_1a0->data;
    *(int **)(in_RDI + 0x120) = local_1a0->refcount;
    *(size_t *)(in_RDI + 0x128) = local_1a0->elemsize;
    *(int *)(in_RDI + 0x130) = local_1a0->elempack;
    *(Allocator **)(in_RDI + 0x138) = local_1a0->allocator;
    *(int *)(in_RDI + 0x140) = local_1a0->dims;
    *(int *)(in_RDI + 0x144) = local_1a0->w;
    *(int *)(in_RDI + 0x148) = local_1a0->h;
    *(int *)(in_RDI + 0x14c) = local_1a0->d;
    *(int *)(in_RDI + 0x150) = local_1a0->c;
    *(size_t *)(in_RDI + 0x158) = local_1a0->cstep;
  }
  local_208 = &local_338;
  local_190 = pMVar3;
  local_c0 = local_208;
  if (local_338.refcount != (int *)0x0) {
    local_c4 = 0xffffffff;
    LOCK();
    local_c8 = *local_338.refcount;
    *local_338.refcount = *local_338.refcount + -1;
    UNLOCK();
    if (local_c8 == 1) {
      if (local_338.allocator == (Allocator *)0x0) {
        if (local_338.data != (void *)0x0) {
          free(local_338.data);
        }
      }
      else {
        (*(local_338.allocator)->_vptr_Allocator[3])(local_338.allocator,local_338.data);
      }
    }
  }
  local_338.data = (void *)0x0;
  local_338.elemsize = 0;
  local_338.elempack = 0;
  local_338.dims = 0;
  local_338.w = 0;
  local_338.h = 0;
  local_338.d = 0;
  local_338.c = 0;
  local_338.cstep = 0;
  local_338.refcount = (int *)0x0;
  local_1f8 = &local_380;
  local_e0 = local_1f8;
  if (local_380.refcount != (int *)0x0) {
    local_e4 = 0xffffffff;
    LOCK();
    local_e8 = *local_380.refcount;
    *local_380.refcount = *local_380.refcount + -1;
    UNLOCK();
    if (local_e8 == 1) {
      if (local_380.allocator == (Allocator *)0x0) {
        local_48 = local_380.data;
        if (local_380.data != (void *)0x0) {
          free(local_380.data);
        }
      }
      else {
        (*(local_380.allocator)->_vptr_Allocator[3])(local_380.allocator,local_380.data);
      }
    }
  }
  local_380.data = (void *)0x0;
  local_380.elemsize = 0;
  local_380.elempack = 0;
  local_380.dims = 0;
  local_380.w = 0;
  local_380.h = 0;
  local_380.d = 0;
  local_380.c = 0;
  local_380.cstep = 0;
  local_380.refcount = (int *)0x0;
  local_230 = &local_410;
  local_410.data = (void *)0x0;
  local_410.refcount = (int *)0x0;
  local_410.elemsize = 0;
  local_410.elempack = 0;
  local_410.allocator = (Allocator *)0x0;
  local_410.dims = 0;
  local_410.w = 0;
  local_410.h = 0;
  local_410.d = 0;
  local_410.c = 0;
  local_410.cstep = 0;
  ParamDict::get(&local_3c8,local_250,2,local_230);
  pMVar3 = (Mat *)(in_RDI + 0x160);
  local_1c0 = &local_3c8;
  local_1b8 = pMVar3;
  if (pMVar3 != local_1c0) {
    if (local_3c8.refcount != (int *)0x0) {
      local_1c4 = 1;
      LOCK();
      local_1c8 = *local_3c8.refcount;
      *local_3c8.refcount = *local_3c8.refcount + 1;
      UNLOCK();
    }
    local_140 = pMVar3;
    if (*(long *)(in_RDI + 0x168) != 0) {
      piVar1 = *(int **)(in_RDI + 0x168);
      local_144 = 0xffffffff;
      LOCK();
      local_148 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_148 == 1) {
        if (*(long *)(in_RDI + 0x180) == 0) {
          local_18 = pMVar3->data;
          if (local_18 != (void *)0x0) {
            free(local_18);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x180) + 0x18))(*(long **)(in_RDI + 0x180),pMVar3->data)
          ;
        }
      }
    }
    pMVar3->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x170) = 0;
    *(undefined4 *)(in_RDI + 0x178) = 0;
    *(undefined4 *)(in_RDI + 0x188) = 0;
    *(undefined4 *)(in_RDI + 0x18c) = 0;
    *(undefined4 *)(in_RDI + 400) = 0;
    *(undefined4 *)(in_RDI + 0x194) = 0;
    *(undefined4 *)(in_RDI + 0x198) = 0;
    *(undefined8 *)(in_RDI + 0x1a0) = 0;
    *(undefined8 *)(in_RDI + 0x168) = 0;
    pMVar3->data = local_1c0->data;
    *(int **)(in_RDI + 0x168) = local_1c0->refcount;
    *(size_t *)(in_RDI + 0x170) = local_1c0->elemsize;
    *(int *)(in_RDI + 0x178) = local_1c0->elempack;
    *(Allocator **)(in_RDI + 0x180) = local_1c0->allocator;
    *(int *)(in_RDI + 0x188) = local_1c0->dims;
    *(int *)(in_RDI + 0x18c) = local_1c0->w;
    *(int *)(in_RDI + 400) = local_1c0->h;
    *(int *)(in_RDI + 0x194) = local_1c0->d;
    *(int *)(in_RDI + 0x198) = local_1c0->c;
    *(size_t *)(in_RDI + 0x1a0) = local_1c0->cstep;
  }
  local_1e8 = &local_3c8;
  local_1b0 = pMVar3;
  local_100 = local_1e8;
  if (local_3c8.refcount != (int *)0x0) {
    local_104 = 0xffffffff;
    LOCK();
    local_108 = *local_3c8.refcount;
    *local_3c8.refcount = *local_3c8.refcount + -1;
    UNLOCK();
    if (local_108 == 1) {
      if (local_3c8.allocator == (Allocator *)0x0) {
        if (local_3c8.data != (void *)0x0) {
          free(local_3c8.data);
        }
      }
      else {
        (*(local_3c8.allocator)->_vptr_Allocator[3])(local_3c8.allocator,local_3c8.data);
      }
    }
  }
  local_3c8.data = (void *)0x0;
  local_3c8.elemsize = 0;
  local_3c8.elempack = 0;
  local_3c8.dims = 0;
  local_3c8.w = 0;
  local_3c8.h = 0;
  local_3c8.d = 0;
  local_3c8.c = 0;
  local_3c8.cstep = 0;
  local_3c8.refcount = (int *)0x0;
  local_1d8 = &local_410;
  local_120 = local_1d8;
  if (local_410.refcount != (int *)0x0) {
    local_124 = 0xffffffff;
    LOCK();
    local_128 = *local_410.refcount;
    *local_410.refcount = *local_410.refcount + -1;
    UNLOCK();
    if (local_128 == 1) {
      if (local_410.allocator == (Allocator *)0x0) {
        local_28 = local_410.data;
        if (local_410.data != (void *)0x0) {
          free(local_410.data);
        }
      }
      else {
        (*(local_410.allocator)->_vptr_Allocator[3])(local_410.allocator,local_410.data);
      }
    }
  }
  local_410.data = (void *)0x0;
  local_410.elemsize = 0;
  local_410.elempack = 0;
  local_410.dims = 0;
  local_410.w = 0;
  local_410.h = 0;
  local_410.d = 0;
  local_410.c = 0;
  local_410.cstep = 0;
  local_410.refcount = (int *)0x0;
  fVar4 = ParamDict::get(local_250,3,0.1);
  *(float *)(in_RDI + 0x1a8) = fVar4;
  fVar4 = ParamDict::get(local_250,4,0.1);
  *(float *)(in_RDI + 0x1ac) = fVar4;
  fVar4 = ParamDict::get(local_250,5,0.2);
  *(float *)(in_RDI + 0x1b0) = fVar4;
  fVar4 = ParamDict::get(local_250,6,0.2);
  *(float *)(in_RDI + 0x1b4) = fVar4;
  iVar2 = ParamDict::get(local_250,7,1);
  *(int *)(in_RDI + 0x1b8) = iVar2;
  iVar2 = ParamDict::get(local_250,8,0);
  *(int *)(in_RDI + 0x1bc) = iVar2;
  iVar2 = ParamDict::get(local_250,9,0);
  *(int *)(in_RDI + 0x1c0) = iVar2;
  iVar2 = ParamDict::get(local_250,10,0);
  *(int *)(in_RDI + 0x1c4) = iVar2;
  fVar4 = ParamDict::get(local_250,0xb,-233.0);
  *(float *)(in_RDI + 0x1c8) = fVar4;
  fVar4 = ParamDict::get(local_250,0xc,-233.0);
  *(float *)(in_RDI + 0x1cc) = fVar4;
  fVar4 = ParamDict::get(local_250,0xd,0.0);
  *(float *)(in_RDI + 0x1d0) = fVar4;
  iVar2 = ParamDict::get(local_250,0xe,0);
  *(bool *)(in_RDI + 0x1d4) = iVar2 != 0;
  iVar2 = ParamDict::get(local_250,0xf,0);
  *(bool *)(in_RDI + 0x1d5) = iVar2 != 0;
  return 0;
}

Assistant:

int PriorBox::load_param(const ParamDict& pd)
{
    min_sizes = pd.get(0, Mat());
    max_sizes = pd.get(1, Mat());
    aspect_ratios = pd.get(2, Mat());
    variances[0] = pd.get(3, 0.1f);
    variances[1] = pd.get(4, 0.1f);
    variances[2] = pd.get(5, 0.2f);
    variances[3] = pd.get(6, 0.2f);
    flip = pd.get(7, 1);
    clip = pd.get(8, 0);
    image_width = pd.get(9, 0);
    image_height = pd.get(10, 0);
    step_width = pd.get(11, -233.f);
    step_height = pd.get(12, -233.f);
    offset = pd.get(13, 0.f);
    step_mmdetection = pd.get(14, 0);
    center_mmdetection = pd.get(15, 0);

    return 0;
}